

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_precompile_mod_augments_deviations(lysp_module *pmod,ly_set *mod_set)

{
  ly_bool lVar1;
  LY_ERR LVar2;
  void **local_1120;
  lysp_ext_instance *local_1110;
  lysp_ext_instance *local_1100;
  undefined1 local_10f0 [8];
  ly_set set;
  lysp_node_augment *aug;
  lys_module *m;
  lysc_ctx ctx;
  uint64_t v;
  uint64_t u;
  LY_ERR ret;
  ly_set *mod_set_local;
  lysp_module *pmod_local;
  
  u._4_4_ = LY_SUCCESS;
  memset(&m,0,0x10a0);
  memset(local_10f0,0,0x10);
  m = (lys_module *)pmod->mod->ctx;
  ctx.ctx = (ly_ctx *)pmod->mod;
  ctx.pmod = (lysp_module *)0x0;
  ctx.unres._0_4_ = 1;
  ctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
  ctx._136_8_ = pmod->mod->ctx;
  ctx.cur_mod = (lys_module *)pmod;
  for (set.field_2 = (anon_union_8_3_0df1e6ad_for_ly_set_2)pmod->augments;
      set.field_2.dnodes != (lyd_node **)0x0;
      set.field_2 = *(anon_union_8_3_0df1e6ad_for_ly_set_2 *)(set.field_2.dnodes + 2)) {
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,"{augment}");
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,(char *)set.field_2.dnodes[3]);
    u._4_4_ = lys_nodeid_mod_check
                        ((lysc_ctx *)&m,(char *)set.field_2.dnodes[3],'\x01',(ly_set *)local_10f0,
                         (lysc_nodeid **)0x0,(lys_module **)&aug);
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,(char *)0x0);
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,(char *)0x0);
    if ((u._4_4_ != LY_SUCCESS) ||
       (((LVar2 = lys_array_add_mod_ref
                            ((lysc_ctx *)&m,pmod->mod,(lys_module ***)((long)&aug[1].field_0 + 8)),
         LVar2 != LY_EEXIST ||
         (lVar1 = lys_precompile_mod_set_is_all_implemented((ly_set *)local_10f0), lVar1 == '\0'))
        && (u._4_4_ = ly_set_merge(mod_set,(ly_set *)local_10f0,'\0',(_func_void_ptr_void_ptr *)0x0)
           , u._4_4_ != LY_SUCCESS)))) goto LAB_0017efc6;
    ly_set_erase((ly_set *)local_10f0,(_func_void_void_ptr *)0x0);
  }
  v = 0;
  while( true ) {
    if (pmod->deviations == (lysp_deviation *)0x0) {
      local_1100 = (lysp_ext_instance *)0x0;
    }
    else {
      local_1100 = pmod->deviations[-1].exts;
    }
    if (local_1100 <= v) {
      v = 0;
      goto LAB_0017ed83;
    }
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,"{deviation}");
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,pmod->deviations[v].nodeid);
    u._4_4_ = lys_nodeid_mod_check
                        ((lysc_ctx *)&m,pmod->deviations[v].nodeid,'\x01',(ly_set *)local_10f0,
                         (lysc_nodeid **)0x0,(lys_module **)&aug);
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,(char *)0x0);
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,(char *)0x0);
    if ((u._4_4_ != LY_SUCCESS) ||
       (((LVar2 = lys_array_add_mod_ref
                            ((lysc_ctx *)&m,pmod->mod,(lys_module ***)&aug[1].field_0.node.next),
         LVar2 != LY_EEXIST ||
         (lVar1 = lys_precompile_mod_set_is_all_implemented((ly_set *)local_10f0), lVar1 == '\0'))
        && (u._4_4_ = ly_set_merge(mod_set,(ly_set *)local_10f0,'\0',(_func_void_ptr_void_ptr *)0x0)
           , u._4_4_ != LY_SUCCESS)))) break;
    ly_set_erase((ly_set *)local_10f0,(_func_void_void_ptr *)0x0);
    v = v + 1;
  }
LAB_0017efc6:
  ly_set_erase((ly_set *)local_10f0,(_func_void_void_ptr *)0x0);
  return u._4_4_;
LAB_0017ed83:
  if (pmod->exts == (lysp_ext_instance *)0x0) {
    local_1110 = (lysp_ext_instance *)0x0;
  }
  else {
    local_1110 = pmod->exts[-1].exts;
  }
  if (local_1110 <= v) goto LAB_0017efc6;
  set.field_2.dnodes = (lyd_node **)0x0;
  ctx.path[0xfe8] = '\0';
  ctx.path[0xfe9] = '\0';
  ctx.path[0xfea] = '\0';
  ctx.path[0xfeb] = '\0';
  ctx.path[0xfec] = '\0';
  ctx.path[0xfed] = '\0';
  ctx._4254_2_ = 0;
  while( true ) {
    if (pmod->exts[v].substmts == (lysp_ext_substmt *)0x0) {
      local_1120 = (void **)0x0;
    }
    else {
      local_1120 = pmod->exts[v].substmts[-1].storage_p;
    }
    if (local_1120 <= (ulong)ctx._4248_8_) goto LAB_0017eead;
    if (pmod->exts[v].substmts[ctx._4248_8_].stmt == LY_STMT_AUGMENT) break;
    ctx._4248_8_ = ctx._4248_8_ + 1;
  }
  set.field_2 = *(anon_union_8_3_0df1e6ad_for_ly_set_2 *)
                 pmod->exts[v].substmts[ctx._4248_8_].storage_p;
LAB_0017eead:
  if (set.field_2.dnodes != (lyd_node **)0x0) {
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,"{ext-augment}");
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,(char *)set.field_2.dnodes[3]);
    u._4_4_ = lys_nodeid_mod_check
                        ((lysc_ctx *)&m,(char *)set.field_2.dnodes[3],'\x01',(ly_set *)local_10f0,
                         (lysc_nodeid **)0x0,(lys_module **)&aug);
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,(char *)0x0);
    lysc_update_path((lysc_ctx *)&m,(lys_module *)0x0,(char *)0x0);
    if ((u._4_4_ != LY_SUCCESS) ||
       (((LVar2 = lys_array_add_mod_ref
                            ((lysc_ctx *)&m,pmod->mod,(lys_module ***)((long)&aug[1].field_0 + 8)),
         LVar2 != LY_EEXIST ||
         (lVar1 = lys_precompile_mod_set_is_all_implemented((ly_set *)local_10f0), lVar1 == '\0'))
        && (u._4_4_ = ly_set_merge(mod_set,(ly_set *)local_10f0,'\0',(_func_void_ptr_void_ptr *)0x0)
           , u._4_4_ != LY_SUCCESS)))) goto LAB_0017efc6;
    ly_set_erase((ly_set *)local_10f0,(_func_void_void_ptr *)0x0);
  }
  v = v + 1;
  goto LAB_0017ed83;
}

Assistant:

static LY_ERR
lys_precompile_mod_augments_deviations(struct lysp_module *pmod, struct ly_set *mod_set)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v;
    struct lysc_ctx ctx = {0};
    struct lys_module *m;
    struct lysp_node_augment *aug;
    struct ly_set set = {0};

    LYSC_CTX_INIT_PMOD(ctx, pmod, NULL);

    LY_LIST_FOR(pmod->augments, aug) {
        /* get target module */
        lysc_update_path(&ctx, NULL, "{augment}");
        lysc_update_path(&ctx, NULL, aug->nodeid);
        ret = lys_nodeid_mod_check(&ctx, aug->nodeid, 1, &set, NULL, &m);
        lysc_update_path(&ctx, NULL, NULL);
        lysc_update_path(&ctx, NULL, NULL);
        LY_CHECK_GOTO(ret, cleanup);

        /* add this module into the target module augmented_by, if not there and implemented */
        if ((lys_array_add_mod_ref(&ctx, pmod->mod, &m->augmented_by) != LY_EEXIST) ||
                !lys_precompile_mod_set_is_all_implemented(&set)) {
            LY_CHECK_GOTO(ret = ly_set_merge(mod_set, &set, 0, NULL), cleanup);
        }
        ly_set_erase(&set, NULL);
    }

    LY_ARRAY_FOR(pmod->deviations, u) {
        /* get target module */
        lysc_update_path(&ctx, NULL, "{deviation}");
        lysc_update_path(&ctx, NULL, pmod->deviations[u].nodeid);
        ret = lys_nodeid_mod_check(&ctx, pmod->deviations[u].nodeid, 1, &set, NULL, &m);
        lysc_update_path(&ctx, NULL, NULL);
        lysc_update_path(&ctx, NULL, NULL);
        LY_CHECK_GOTO(ret, cleanup);

        /* add this module into the target module deviated_by, if not there and implemented */
        if ((lys_array_add_mod_ref(&ctx, pmod->mod, &m->deviated_by) != LY_EEXIST) ||
                !lys_precompile_mod_set_is_all_implemented(&set)) {
            LY_CHECK_GOTO(ret = ly_set_merge(mod_set, &set, 0, NULL), cleanup);
        }
        ly_set_erase(&set, NULL);
    }

    LY_ARRAY_FOR(pmod->exts, u) {
        aug = NULL;
        LY_ARRAY_FOR(pmod->exts[u].substmts, v) {
            if (pmod->exts[u].substmts[v].stmt == LY_STMT_AUGMENT) {
                aug = *(pmod->exts[u].substmts[v].storage_p);
                break;
            }
        }
        if (!aug) {
            continue;
        }

        /* get target module */
        lysc_update_path(&ctx, NULL, "{ext-augment}");
        lysc_update_path(&ctx, NULL, aug->nodeid);
        ret = lys_nodeid_mod_check(&ctx, aug->nodeid, 1, &set, NULL, &m);
        lysc_update_path(&ctx, NULL, NULL);
        lysc_update_path(&ctx, NULL, NULL);
        LY_CHECK_GOTO(ret, cleanup);

        /* add this module into the target module augmented_by, if not there and implemented */
        if ((lys_array_add_mod_ref(&ctx, pmod->mod, &m->augmented_by) != LY_EEXIST) ||
                !lys_precompile_mod_set_is_all_implemented(&set)) {
            LY_CHECK_GOTO(ret = ly_set_merge(mod_set, &set, 0, NULL), cleanup);
        }
        ly_set_erase(&set, NULL);
    }

cleanup:
    ly_set_erase(&set, NULL);
    return ret;
}